

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O0

void __thiscall
tst_SerialiserCommon::checkModelEqual
          (tst_SerialiserCommon *this,QAbstractItemModel *a,QAbstractItemModel *b,
          QModelIndex *aParent,QModelIndex *bParent,bool checkHeaders)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  bool local_1d6;
  bool local_1d5;
  int local_1d4;
  undefined1 local_1d0 [3];
  bool hasChildren;
  QList<int> local_1b8;
  QMap<int,_QVariant> local_1a0;
  QMap<int,_QVariant> bItemData;
  QMap<int,_QVariant> aItemData;
  QModelIndex bIdx;
  QModelIndex aIdx;
  int j;
  int i_2;
  QVariant local_138;
  QVariant local_118;
  QVariant local_f8;
  int local_d4;
  undefined1 local_d0 [4];
  int i_1;
  QVariant local_b0;
  QVariant local_80;
  QVariant local_60;
  int local_40;
  int local_3c;
  int i;
  int colC;
  int rowC;
  bool aParentValid;
  bool checkHeaders_local;
  QModelIndex *bParent_local;
  QModelIndex *aParent_local;
  QAbstractItemModel *b_local;
  QAbstractItemModel *a_local;
  tst_SerialiserCommon *this_local;
  
  colC._3_1_ = checkHeaders;
  _rowC = bParent;
  bParent_local = aParent;
  aParent_local = (QModelIndex *)b;
  b_local = a;
  a_local = (QAbstractItemModel *)this;
  colC._2_1_ = QModelIndex::isValid(aParent);
  i = (**(code **)(*(long *)b_local + 0x78))(b_local,bParent_local);
  iVar3 = (**(code **)(*(long *)aParent_local + 0x78))(aParent_local,_rowC);
  uVar4 = QTest::qCompare(iVar3,i,"b->rowCount(bParent)","rowC",
                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                          ,0x3a);
  if ((uVar4 & 1) != 0) {
    local_3c = (**(code **)(*(long *)b_local + 0x80))(b_local,bParent_local);
    iVar3 = (**(code **)(*(long *)aParent_local + 0x80))(aParent_local,_rowC);
    uVar4 = QTest::qCompare(iVar3,local_3c,"b->columnCount(bParent)","colC",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                            ,0x3c);
    if ((uVar4 & 1) != 0) {
      if (((colC._2_1_ & 1) == 0) && ((colC._3_1_ & 1) != 0)) {
        for (local_40 = 0; local_40 < i; local_40 = local_40 + 1) {
          (**(code **)(*(long *)b_local + 0xa0))(&local_60,b_local,local_40);
          (**(code **)(*(long *)aParent_local + 0xa0))(&local_80,aParent_local,local_40,2,0);
          bVar1 = QTest::qCompare<QVariant,QVariant>
                            (&local_60,&local_80,"a->headerData(i, Qt::Vertical)",
                             "b->headerData(i, Qt::Vertical)",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                             ,0x3f);
          QVariant::~QVariant(&local_80);
          QVariant::~QVariant(&local_60);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return;
          }
          (**(code **)(*(long *)b_local + 0xa0))(&local_b0,b_local,local_40);
          (**(code **)(*(long *)aParent_local + 0xa0))(local_d0,aParent_local,local_40,2,0x100);
          bVar1 = QTest::qCompare<QVariant,QVariant>
                            (&local_b0,(QVariant *)local_d0,
                             "a->headerData(i, Qt::Vertical, Qt::UserRole)",
                             "b->headerData(i, Qt::Vertical, Qt::UserRole)",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                             ,0x40);
          QVariant::~QVariant((QVariant *)local_d0);
          QVariant::~QVariant(&local_b0);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return;
          }
        }
        for (local_d4 = 0; local_d4 < local_3c; local_d4 = local_d4 + 1) {
          (**(code **)(*(long *)b_local + 0xa0))(&local_f8,b_local,local_d4);
          (**(code **)(*(long *)aParent_local + 0xa0))(&local_118,aParent_local,local_d4,1,0);
          bVar1 = QTest::qCompare<QVariant,QVariant>
                            (&local_f8,&local_118,"a->headerData(i, Qt::Horizontal)",
                             "b->headerData(i, Qt::Horizontal)",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                             ,0x43);
          QVariant::~QVariant(&local_118);
          QVariant::~QVariant(&local_f8);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return;
          }
          (**(code **)(*(long *)b_local + 0xa0))(&local_138,b_local,local_d4);
          (**(code **)(*(long *)aParent_local + 0xa0))(&j,aParent_local,local_d4,1,0x100);
          bVar1 = QTest::qCompare<QVariant,QVariant>
                            (&local_138,(QVariant *)&j,
                             "a->headerData(i, Qt::Horizontal, Qt::UserRole)",
                             "b->headerData(i, Qt::Horizontal, Qt::UserRole)",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                             ,0x44);
          QVariant::~QVariant((QVariant *)&j);
          QVariant::~QVariant(&local_138);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return;
          }
        }
      }
      for (aIdx.m._4_4_ = 0; aIdx.m._4_4_ < i; aIdx.m._4_4_ = aIdx.m._4_4_ + 1) {
        for (aIdx.m._0_4_ = 0; (int)aIdx.m < local_3c; aIdx.m._0_4_ = (int)aIdx.m + 1) {
          (**(code **)(*(long *)b_local + 0x60))
                    (&bIdx.m,b_local,aIdx.m._4_4_,(int)aIdx.m,bParent_local);
          (**(code **)(*(long *)aParent_local + 0x60))
                    (&aItemData,aParent_local,aIdx.m._4_4_,(int)aIdx.m,_rowC);
          (**(code **)(*(long *)b_local + 0xb0))(&bItemData,b_local,&bIdx.m);
          (**(code **)(*(long *)aParent_local + 0xb0))(&local_1a0,aParent_local,&aItemData);
          QMap<int,_QVariant>::keys(&local_1b8,&local_1a0);
          QMap<int,_QVariant>::keys((QList<int> *)local_1d0,&bItemData);
          bVar1 = QTest::qCompare<int>
                            (&local_1b8,(QList<int> *)local_1d0,"bItemData.keys()",
                             "aItemData.keys()",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                             ,0x4d);
          QList<int>::~QList((QList<int> *)local_1d0);
          QList<int>::~QList(&local_1b8);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            bVar1 = QTest::qCompare<QMap<int,QVariant>,QMap<int,QVariant>>
                              (&local_1a0,&bItemData,"bItemData","aItemData",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                               ,0x4e);
            if (bVar1) {
              bVar2 = (**(code **)(*(long *)b_local + 0x88))(b_local,&bIdx.m);
              local_1d5 = (bool)(bVar2 & 1);
              bVar2 = (**(code **)(*(long *)aParent_local + 0x88))(aParent_local,&aItemData);
              local_1d6 = (bool)(bVar2 & 1);
              bVar1 = QTest::qCompare<bool,bool>
                                (&local_1d6,&local_1d5,"b->hasChildren(bIdx)","hasChildren",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                                 ,0x50);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                if ((local_1d5 & 1U) != 0) {
                  checkModelEqual(this,b_local,(QAbstractItemModel *)aParent_local,
                                  (QModelIndex *)&bIdx.m,(QModelIndex *)&aItemData,
                                  (bool)(colC._3_1_ & 1));
                }
                local_1d4 = 0;
              }
              else {
                local_1d4 = 1;
              }
            }
            else {
              local_1d4 = 1;
            }
          }
          else {
            local_1d4 = 1;
          }
          QMap<int,_QVariant>::~QMap(&local_1a0);
          QMap<int,_QVariant>::~QMap(&bItemData);
          if (local_1d4 != 0) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void tst_SerialiserCommon::checkModelEqual(const QAbstractItemModel *a, const QAbstractItemModel *b, const QModelIndex &aParent,
                                           const QModelIndex &bParent, bool checkHeaders) const
{
    Q_ASSERT(a);
    Q_ASSERT(b);
    const bool aParentValid = aParent.isValid();
    Q_ASSERT(!aParentValid || aParent.model() == a);
    Q_ASSERT(!bParent.isValid() || bParent.model() == b);
    Q_ASSERT(aParentValid == bParent.isValid());
    const int rowC = a->rowCount(aParent);
    QCOMPARE(b->rowCount(bParent), rowC);
    const int colC = a->columnCount(aParent);
    QCOMPARE(b->columnCount(bParent), colC);
    if (!aParentValid && checkHeaders) {
        for (int i = 0; i < rowC; ++i) {
            QCOMPARE(a->headerData(i, Qt::Vertical), b->headerData(i, Qt::Vertical));
            QCOMPARE(a->headerData(i, Qt::Vertical, Qt::UserRole), b->headerData(i, Qt::Vertical, Qt::UserRole));
        }
        for (int i = 0; i < colC; ++i) {
            QCOMPARE(a->headerData(i, Qt::Horizontal), b->headerData(i, Qt::Horizontal));
            QCOMPARE(a->headerData(i, Qt::Horizontal, Qt::UserRole), b->headerData(i, Qt::Horizontal, Qt::UserRole));
        }
    }
    for (int i = 0; i < rowC; ++i) {
        for (int j = 0; j < colC; ++j) {
            const QModelIndex aIdx = a->index(i, j, aParent);
            const QModelIndex bIdx = b->index(i, j, bParent);
            const auto aItemData = a->itemData(aIdx);
            const auto bItemData = b->itemData(bIdx);
            QCOMPARE(bItemData.keys(), aItemData.keys());
            QCOMPARE(bItemData, aItemData);
            const bool hasChildren = a->hasChildren(aIdx);
            QCOMPARE(b->hasChildren(bIdx), hasChildren);
            if (hasChildren) {
                checkModelEqual(a, b, aIdx, bIdx, checkHeaders);
            }
        }
    }
}